

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O0

int __thiscall FlatNode::pathIndex(FlatNode *this,QString *filepath)

{
  int iVar1;
  qsizetype qVar2;
  int *piVar3;
  QString *in_RSI;
  long in_FS_OFFSET;
  int Uindex;
  int Windex;
  QString *pQVar4;
  CaseSensitivity cs;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  QString *in_stack_ffffffffffffff90;
  int local_4c;
  char *in_stack_ffffffffffffffb8;
  int local_2c [8];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RSI;
  QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   in_stack_ffffffffffffffb8);
  cs = (CaseSensitivity)((ulong)pQVar4 >> 0x20);
  qVar2 = QString::lastIndexOf
                    (in_stack_ffffffffffffff90,
                     (QString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),cs);
  iVar1 = (int)qVar2;
  QString::~QString((QString *)0x281f33);
  local_c = iVar1;
  QString::QString((QString *)CONCAT44(iVar1,in_stack_ffffffffffffff88),in_stack_ffffffffffffffb8);
  qVar2 = QString::lastIndexOf(in_RSI,(QString *)CONCAT44(iVar1,in_stack_ffffffffffffff88),cs);
  local_4c = (int)qVar2;
  QString::~QString((QString *)0x281f78);
  local_2c[0] = local_4c;
  if ((local_c == -1) || (local_4c == -1)) {
    if (local_c != -1) {
      local_4c = local_c;
    }
  }
  else {
    piVar3 = qMax<int>(&local_c,local_2c);
    local_4c = *piVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_4c;
}

Assistant:

int pathIndex(const QString &filepath) {
        int Windex = filepath.lastIndexOf("\\");
        int Uindex = filepath.lastIndexOf("/");
        if (Windex != -1 && Uindex != -1)
            return qMax(Windex, Uindex);
        else if (Windex != -1)
            return Windex;
        return Uindex;
    }